

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

string * __thiscall
cmInstallCommand::GetDestinationForType
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args,
          string *type)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  
  if ((args != (cmInstallCommandArguments *)0x0) &&
     (psVar3 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args),
     psVar3->_M_string_length != 0)) {
    psVar3 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
    return __return_storage_ptr__;
  }
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    GetRuntimeDestination_abi_cxx11_(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 == 0) {
      GetSbinDestination_abi_cxx11_(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)type);
      if (iVar2 == 0) {
        GetSysconfDestination_abi_cxx11_
                  (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)type);
        if (iVar2 == 0) {
          GetSharedStateDestination_abi_cxx11_
                    (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)type);
          if (iVar2 == 0) {
            GetLocalStateDestination_abi_cxx11_
                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)type);
            if (iVar2 == 0) {
              GetRunStateDestination_abi_cxx11_
                        (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)type);
              if (iVar2 == 0) {
                GetLibraryDestination_abi_cxx11_
                          (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)type);
                if (iVar2 == 0) {
                  GetIncludeDestination_abi_cxx11_
                            (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)type);
                  if (iVar2 == 0) {
                    GetDataDestination_abi_cxx11_
                              (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)type);
                    if (iVar2 == 0) {
                      GetInfoDestination_abi_cxx11_
                                (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)type);
                      if (iVar2 == 0) {
                        GetLocaleDestination_abi_cxx11_
                                  (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)type);
                        if (iVar2 == 0) {
                          GetManDestination_abi_cxx11_
                                    (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)type);
                          if (iVar2 == 0) {
                            GetDocDestination_abi_cxx11_
                                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0)
                            ;
                          }
                          else {
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)__return_storage_ptr__,"");
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetDestinationForType(
  const cmInstallCommandArguments* args, const std::string& type)
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  if (type == "BIN") {
    return this->GetRuntimeDestination(nullptr);
  }
  if (type == "SBIN") {
    return this->GetSbinDestination(nullptr);
  }
  if (type == "SYSCONF") {
    return this->GetSysconfDestination(nullptr);
  }
  if (type == "SHAREDSTATE") {
    return this->GetSharedStateDestination(nullptr);
  }
  if (type == "LOCALSTATE") {
    return this->GetLocalStateDestination(nullptr);
  }
  if (type == "RUNSTATE") {
    return this->GetRunStateDestination(nullptr);
  }
  if (type == "LIB") {
    return this->GetLibraryDestination(nullptr);
  }
  if (type == "INCLUDE") {
    return this->GetIncludeDestination(nullptr);
  }
  if (type == "DATA") {
    return this->GetDataDestination(nullptr);
  }
  if (type == "INFO") {
    return this->GetInfoDestination(nullptr);
  }
  if (type == "LOCALE") {
    return this->GetLocaleDestination(nullptr);
  }
  if (type == "MAN") {
    return this->GetManDestination(nullptr);
  }
  if (type == "DOC") {
    return this->GetDocDestination(nullptr);
  }
  return "";
}